

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::PrintDefaultActions(POMDPX *this)

{
  ostream *poVar1;
  reference ppPVar2;
  reference va;
  vector<int,_std::allocator<int>_> local_30;
  int local_18;
  int local_14;
  int s;
  int num_states;
  POMDPX *this_local;
  
  _s = this;
  local_14 = (*(this->super_MDP)._vptr_MDP[2])();
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"s = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1," ");
    ppPVar2 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator[]
                        (&this->states_,(long)local_18);
    std::vector<int,_std::allocator<int>_>::vector(&local_30,&(*ppPVar2)->vec_id);
    poVar1 = despot::operator<<(poVar1,&local_30);
    poVar1 = std::operator<<(poVar1," ");
    va = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                   (&(this->super_MDP).policy_,(long)local_18);
    poVar1 = despot::operator<<(poVar1,va);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::~vector(&local_30);
    ppPVar2 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator[]
                        (&this->states_,(long)local_18);
    (*(this->super_MDP)._vptr_MDP[0x15])(this,*ppPVar2,&std::cout);
  }
  return;
}

Assistant:

void POMDPX::PrintDefaultActions() {
	int num_states = NumStates();
	for (int s = 0; s < num_states; s++) {
		cout << "s = " << s << " " << states_[s]->vec_id << " " << policy_[s]
			<< endl;
		PrintState(*states_[s]);
	}
}